

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O1

void __thiscall QColumnViewGrip::mouseDoubleClickEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  long *plVar1;
  int iVar2;
  LayoutDirection LVar3;
  int iVar4;
  
  plVar1 = *(long **)(*(long *)(this + 8) + 0x10);
  iVar2 = (**(code **)(*plVar1 + 0x70))(plVar1);
  iVar4 = ~*(uint *)(plVar1[4] + 0x1c) + iVar2 + *(int *)(plVar1[4] + 0x14);
  LVar3 = QWidget::layoutDirection((QWidget *)this);
  iVar2 = -iVar4;
  if (LVar3 != RightToLeft) {
    iVar2 = iVar4;
  }
  moveGrip(this,iVar2);
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void QColumnViewGrip::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_UNUSED(event);
    QWidget *parentWidget = (QWidget*)parent();
    int offset = parentWidget->sizeHint().width() - parentWidget->width();
    if (isRightToLeft())
        offset *= -1;
    moveGrip(offset);
    event->accept();
}